

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_util.c
# Opt level: O3

void ExUtilDeleteCommandLineArguments(CommandLineArguments *args)

{
  if (args != (CommandLineArguments *)0x0) {
    if (args->own_argv_ != 0) {
      WebPFree(args->argv_);
      WebPFree((args->argv_data_).bytes);
    }
    args->argc_ = 0;
    args->argv_ = (char **)0x0;
    (args->argv_data_).bytes = (uint8_t *)0x0;
    *(undefined8 *)((long)&(args->argv_data_).bytes + 4) = 0;
    *(undefined8 *)((long)&(args->argv_data_).size + 4) = 0;
  }
  return;
}

Assistant:

void ExUtilDeleteCommandLineArguments(CommandLineArguments* const args) {
  if (args != NULL) {
    if (args->own_argv_) {
      WebPFree((void*)args->argv_);
      WebPDataClear(&args->argv_data_);
    }
    ResetCommandLineArguments(0, NULL, args);
  }
}